

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O1

unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_> *node)

{
  long *plVar1;
  undefined8 *puVar2;
  pointer ppVar3;
  long *in_RDX;
  pointer *__ptr;
  undefined8 *puVar4;
  vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  new_outer_dims;
  vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  local_b8;
  Node *local_98;
  long *local_90;
  _Head_base<0UL,_verilogAST::Expression_*,_false> local_88;
  long *local_80;
  long *local_78;
  long *local_70;
  long *local_68;
  long local_60;
  __uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_> local_58;
  long *local_50;
  vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  local_48;
  
  local_68 = *(long **)(*in_RDX + 8);
  *(undefined8 *)(*in_RDX + 8) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
              .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->msb)._M_t.
            super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
  )(&local_b8);
  ppVar3 = local_b8.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b8.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  plVar1 = *(long **)(*in_RDX + 8);
  ((__uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *)
  (*in_RDX + 8))->_M_t =
       (tuple<verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>)ppVar3;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  if ((_Head_base<0UL,_verilogAST::Expression_*,_false>)
      local_b8.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_Head_base<0UL,_verilogAST::Expression_*,_false>)0x0) {
    (*((Node *)&(local_b8.
                 super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first)->_vptr_Node[2])();
  }
  local_b8.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_68 != (long *)0x0) {
    (**(code **)(*local_68 + 0x10))();
  }
  local_68 = (long *)0x0;
  local_70 = *(long **)(*in_RDX + 0x10);
  *(undefined8 *)(*in_RDX + 0x10) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
              .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
            _vptr_Node)(&local_b8,node);
  ppVar3 = local_b8.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b8.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  plVar1 = *(long **)(*in_RDX + 0x10);
  ((tuple<verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_> *)(*in_RDX + 0x10)
  )->super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
       = (_Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>)
         ppVar3;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  if ((_Head_base<0UL,_verilogAST::Expression_*,_false>)
      local_b8.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_Head_base<0UL,_verilogAST::Expression_*,_false>)0x0) {
    (*((Node *)&(local_b8.
                 super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first)->_vptr_Node[2])();
  }
  local_b8.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_70 != (long *)0x0) {
    (**(code **)(*local_70 + 0x10))();
  }
  local_70 = (long *)0x0;
  local_78 = *(long **)(*in_RDX + 0x18);
  *(undefined8 *)(*in_RDX + 0x18) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
              .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
            _vptr_Node)(&local_b8,node);
  ppVar3 = local_b8.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b8.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  plVar1 = *(long **)(*in_RDX + 0x18);
  ((tuple<verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_> *)(*in_RDX + 0x18)
  )->super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
       = (_Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>)
         ppVar3;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  if ((_Head_base<0UL,_verilogAST::Expression_*,_false>)
      local_b8.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_Head_base<0UL,_verilogAST::Expression_*,_false>)0x0) {
    (*((Node *)&(local_b8.
                 super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first)->_vptr_Node[2])();
  }
  local_b8.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_78 != (long *)0x0) {
    (**(code **)(*local_78 + 0x10))();
  }
  local_78 = (long *)0x0;
  if (*in_RDX == 0) {
    local_60 = 0;
  }
  else {
    local_60 = __dynamic_cast(*in_RDX,&Vector::typeinfo,&NDVector::typeinfo,0);
  }
  if (local_60 != 0) {
    local_48.
    super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar4 = *(undefined8 **)(local_60 + 0x20);
    puVar2 = *(undefined8 **)(local_60 + 0x28);
    local_58._M_t.
    super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>.
    super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl =
         (tuple<verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>)
         (tuple<verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>)this;
    local_50 = in_RDX;
    if (puVar4 != puVar2) {
      do {
        local_80 = (long *)*puVar4;
        *puVar4 = 0;
        (*(code *)(((node->_M_t).
                    super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
                    .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
                  _vptr_Node)(&local_98,node,&local_80);
        local_90 = (long *)puVar4[1];
        puVar4[1] = 0;
        (*(code *)(((node->_M_t).
                    super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
                    .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
                  _vptr_Node)(&local_88,node,&local_90);
        local_b8.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98;
        local_98 = (Node *)0x0;
        local_b8.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_88._M_head_impl;
        local_88._M_head_impl = (Expression *)0x0;
        std::
        vector<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>,std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>>>
        ::
        emplace_back<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>>
                  ((vector<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>,std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>>>
                    *)&local_48,
                   (pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
                    *)&local_b8);
        if ((_Head_base<0UL,_verilogAST::Expression_*,_false>)
            local_b8.
            super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Head_base<0UL,_verilogAST::Expression_*,_false>)0x0) {
          (*((Node *)&(local_b8.
                       super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->first)->_vptr_Node[2])();
        }
        local_b8.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((_Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
             )local_b8.
              super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (Expression *)0x0) {
          (**(code **)(*(long *)local_b8.
                                super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x10))();
        }
        local_b8.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        if (local_88._M_head_impl != (Expression *)0x0) {
          (*((local_88._M_head_impl)->super_Node)._vptr_Node[2])();
        }
        local_88._M_head_impl = (Expression *)0x0;
        if (local_90 != (long *)0x0) {
          (**(code **)(*local_90 + 0x10))();
        }
        local_90 = (long *)0x0;
        if (local_98 != (Node *)0x0) {
          (*local_98->_vptr_Node[2])();
        }
        local_98 = (Node *)0x0;
        if (local_80 != (long *)0x0) {
          (**(code **)(*local_80 + 0x10))();
        }
        local_80 = (long *)0x0;
        puVar4 = puVar4 + 2;
      } while (puVar4 != puVar2);
    }
    local_b8.
    super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         *(pointer *)
          &((_Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
             *)(local_60 + 0x20))->super__Head_base<0UL,_verilogAST::Expression_*,_false>;
    local_b8.
    super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         *(pointer *)
          &((_Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
             *)(local_60 + 0x28))->super__Head_base<0UL,_verilogAST::Expression_*,_false>;
    local_b8.
    super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(local_60 + 0x30);
    *(pointer *)(local_60 + 0x20) =
         local_48.
         super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(local_60 + 0x28) =
         local_48.
         super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(local_60 + 0x30) =
         local_48.
         super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ::~vector(&local_b8);
    std::
    vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ::~vector(&local_48);
    in_RDX = local_50;
    this = (Transformer *)
           local_58._M_t.
           super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>.
           super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl;
  }
  *this = (Transformer)*in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<verilogAST::Vector,_std::default_delete<verilogAST::Vector>,_true,_true>)
         (tuple<verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>)this;
}

Assistant:

std::unique_ptr<Vector> Transformer::visit(std::unique_ptr<Vector> node) {
  node->id = this->visit(std::move(node->id));
  node->msb = this->visit(std::move(node->msb));
  node->lsb = this->visit(std::move(node->lsb));
  if (auto ptr = dynamic_cast<NDVector*>(node.get())) {
    std::vector<
        std::pair<std::unique_ptr<Expression>, std::unique_ptr<Expression>>>
        new_outer_dims;
    for (auto& dim : ptr->outer_dims) {
      new_outer_dims.push_back({this->visit(std::move(dim.first)),
                                this->visit(std::move(dim.second))});
    }
    ptr->outer_dims = std::move(new_outer_dims);
  }
  return node;
}